

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O2

bool __thiscall LEFReader::parseUnits(LEFReader *this)

{
  string *tokstr;
  bool bVar1;
  token_t tVar2;
  allocator<char> local_59;
  string local_58;
  double local_38;
  
  tokstr = &this->m_tokstr;
  tVar2 = tokenize(this,tokstr);
  this->m_curtok = tVar2;
  if (tVar2 == TOK_EOL) {
    while( true ) {
      tVar2 = tokenize(this,tokstr);
      this->m_curtok = tVar2;
      if (tVar2 != TOK_IDENT) break;
      bVar1 = std::operator==(tokstr,"DATABASE");
      if (bVar1) {
        tVar2 = tokenize(this,tokstr);
        this->m_curtok = tVar2;
        if ((tVar2 != TOK_IDENT) || (bVar1 = std::operator==(tokstr,"MICRONS"), !bVar1)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_58,"Expects MICRONS keywords after DATABASE\n",&local_59);
          error(this,&local_58);
          goto LAB_00125d0c;
        }
        tVar2 = tokenize(this,tokstr);
        this->m_curtok = tVar2;
        if (tVar2 != TOK_NUMBER) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_58,"Expected a number after DATABASE MICRONS\n",&local_59);
          error(this,&local_58);
          goto LAB_00125d0c;
        }
        local_38 = std::__cxx11::stod(tokstr,(size_t *)0x0);
        tVar2 = tokenize(this,tokstr);
        this->m_curtok = tVar2;
        if (tVar2 != TOK_SEMICOL) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_58,"Expected ; after DATABASE MICRONS <number>\n",&local_59);
          error(this,&local_58);
          goto LAB_00125d0c;
        }
        tVar2 = tokenize(this,tokstr);
        this->m_curtok = tVar2;
        if (tVar2 != TOK_EOL) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_58,"Expected EOL after DATABASE MICRONS <number> ;\n",
                     &local_59);
          error(this,&local_58);
          goto LAB_00125d0c;
        }
        (*this->_vptr_LEFReader[0x14])(local_38,this);
      }
      else {
        bVar1 = std::operator==(tokstr,"END");
        if (bVar1) {
          tVar2 = tokenize(this,tokstr);
          this->m_curtok = tVar2;
          if (tVar2 == TOK_IDENT) {
            bVar1 = std::operator==(tokstr,"UNITS");
            if (bVar1) {
              return true;
            }
            tVar2 = this->m_curtok;
          }
          while ((tVar2 != TOK_EOF && (tVar2 != TOK_EOL))) {
            tVar2 = tokenize(this,tokstr);
            this->m_curtok = tVar2;
          }
        }
        else {
          tVar2 = this->m_curtok;
          while ((tVar2 != TOK_EOF && (tVar2 != TOK_EOL))) {
            tVar2 = tokenize(this,tokstr);
            this->m_curtok = tVar2;
          }
        }
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Expected string in units block\n",&local_59);
    error(this,&local_58);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Expected EOL after UNITS\n",&local_59);
    error(this,&local_58);
  }
LAB_00125d0c:
  std::__cxx11::string::~string((string *)&local_58);
  return false;
}

Assistant:

bool LEFReader::parseUnits()
{
    // UNITS
    //   DATABASE MICRONS ;
    //   ...
    // END UNITS

    // expect EOL after UNITS

    m_curtok = tokenize(m_tokstr);
    if (m_curtok != TOK_EOL)
    {
        error("Expected EOL after UNITS\n");
        return false;
    }

    while(1)
    {
        m_curtok = tokenize(m_tokstr);

        if (m_curtok != TOK_IDENT)
        {
            error("Expected string in units block\n");
            return false;
        }

        if (m_tokstr == "DATABASE")
        {
            m_curtok = tokenize(m_tokstr);
            if ((m_curtok == TOK_IDENT) && (m_tokstr == "MICRONS"))
            {
                m_curtok = tokenize(m_tokstr);
                if (m_curtok == TOK_NUMBER)
                {
                    double micronsd;
                    try
                    {
                        micronsd = std::stod(m_tokstr);
                    }
                    catch(const std::invalid_argument& ia)
                    {
                        error(ia.what());
                        return false;
                    }

                    // expect ; and EOL
                    m_curtok = tokenize(m_tokstr);
                    if (m_curtok != TOK_SEMICOL)
                    {
                        error("Expected ; after DATABASE MICRONS <number>\n");
                        return false;
                    }

                    m_curtok = tokenize(m_tokstr);
                    if (m_curtok != TOK_EOL)
                    {
                        error("Expected EOL after DATABASE MICRONS <number> ;\n");
                        return false;
                    }

                    onDatabaseUnitsMicrons(micronsd);
                }
                else
                {
                    error("Expected a number after DATABASE MICRONS\n");
                    return false;
                }
            }
            else
            {
                error("Expects MICRONS keywords after DATABASE\n");
                return false;
            }
        }
        else if (m_tokstr == "END")
        {
            // check for units
            m_curtok = tokenize(m_tokstr);
            if ((m_curtok == TOK_IDENT) && (m_tokstr == "UNITS"))
            {
                return true;
            }
            else
            {
                // read until EOL
                while ((m_curtok != TOK_EOL) && (m_curtok != TOK_EOF))
                {
                    m_curtok = tokenize(m_tokstr);
                }
            }
        }
        else
        {
            // got something other than DATABASE or END
            // read until EOL
            while ((m_curtok != TOK_EOL) && (m_curtok != TOK_EOF))
            {
                m_curtok = tokenize(m_tokstr);
            }
        }
    }
}